

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

void __thiscall
so_5::mchain_props::details::limited_preallocated_demand_queue::limited_preallocated_demand_queue
          (limited_preallocated_demand_queue *this,capacity_t *capacity)

{
  size_t sVar1;
  allocator<so_5::mchain_props::demand_t> local_31;
  demand_t local_30;
  capacity_t *local_18;
  capacity_t *capacity_local;
  limited_preallocated_demand_queue *this_local;
  
  local_18 = capacity;
  capacity_local = (capacity_t *)this;
  sVar1 = capacity_t::max_size(capacity);
  mchain_props::demand_t::demand_t(&local_30);
  std::allocator<so_5::mchain_props::demand_t>::allocator(&local_31);
  std::vector<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::vector
            (&this->m_storage,sVar1,&local_30,&local_31);
  std::allocator<so_5::mchain_props::demand_t>::~allocator(&local_31);
  mchain_props::demand_t::~demand_t(&local_30);
  sVar1 = capacity_t::max_size(local_18);
  this->m_max_size = sVar1;
  this->m_head = 0;
  this->m_size = 0;
  return;
}

Assistant:

limited_preallocated_demand_queue(
			const capacity_t & capacity )
			:	m_storage( capacity.max_size(), demand_t{} )
			,	m_max_size{ capacity.max_size() }
			,	m_head{ 0 }
			,	m_size{ 0 }
			{}